

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O1

void __thiscall Memory::HeapInfo::SetupBackgroundSweep(HeapInfo *this,RecyclerSweep *recyclerSweep)

{
  long lVar1;
  
  lVar1 = 0x78;
  do {
    HeapBucketGroup<SmallAllocationBlockAttributes>::SetupBackgroundSweep
              ((HeapBucketGroup<SmallAllocationBlockAttributes> *)
               ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
               lVar1),recyclerSweep);
    lVar1 = lVar1 + 0x380;
  } while (lVar1 != 0xa878);
  lVar1 = 0;
  do {
    HeapBucketGroup<MediumAllocationBlockAttributes>::SetupBackgroundSweep
              ((HeapBucketGroup<MediumAllocationBlockAttributes> *)
               ((long)&this->mediumHeapBuckets[0].heapBucket.
                       super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                       .
                       super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                       .super_HeapBucket.heapInfo + lVar1),recyclerSweep);
    lVar1 = lVar1 + 0x380;
  } while (lVar1 != 0x6580);
  return;
}

Assistant:

void
HeapInfo::SetupBackgroundSweep(RecyclerSweep& recyclerSweep)
{
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        this->heapBuckets[i].SetupBackgroundSweep(recyclerSweep);
    }

#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && SMALLBLOCK_MEDIUM_ALLOC
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        this->mediumHeapBuckets[i].SetupBackgroundSweep(recyclerSweep);
    }
#endif
}